

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::anon_unknown_59::Register(ExtensionInfo *info)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  ulong uVar3;
  long lVar4;
  ctrl_t *pcVar5;
  uint uVar6;
  ushort uVar7;
  MessageLite *pMVar8;
  EnumValidityFuncWithArg *pEVar9;
  void *pvVar10;
  LazyEagerVerifyFnType p_Var11;
  FieldType FVar12;
  LazyAnnotation LVar13;
  undefined1 uVar14;
  bool bVar15;
  byte bVar16;
  int iVar17;
  uintptr_t v;
  size_t sVar18;
  reference key;
  LogMessage *pLVar19;
  flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *pfVar20;
  uint uVar21;
  ulong uVar22;
  ushort uVar23;
  long lVar24;
  PolicyFunctions *in_R9;
  anon_union_8_1_a8a14541_for_iterator_2 in_R10;
  anon_union_8_1_a8a14541_for_iterator_2 aVar25;
  ulong uVar26;
  CommonFields *common;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined4 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i match;
  undefined1 auVar36 [16];
  string_view str;
  string_view sVar37;
  FindInfo target;
  ulong local_a8;
  ulong local_98;
  iterator local_88;
  undefined1 local_78 [16];
  anon_union_8_1_a8a14541_for_iterator_2 local_60;
  PolicyFunctions *local_58;
  const_iterator local_50;
  const_iterator local_40;
  
  if (((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
       local_static_registry == '\0') &&
     (iVar17 = __cxa_guard_acquire(&(anonymous_namespace)::
                                    Register(google::protobuf::internal::ExtensionInfo_const&)::
                                    local_static_registry), iVar17 != 0)) {
    pfVar20 = (flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               *)operator_new(0x20);
    (pfVar20->
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    (pfVar20->
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    (pfVar20->
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = (ctrl_t *)0x3bc980;
    OnShutdownRun(OnShutdownDelete<absl::lts_20250127::flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>_>
                  ::anon_class_1_0_00000001::__invoke,pfVar20);
    Register::local_static_registry = pfVar20;
    __cxa_guard_release(&(anonymous_namespace)::
                         Register(google::protobuf::internal::ExtensionInfo_const&)::
                         local_static_registry);
  }
  pfVar20 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ::AssertOnFind<google::protobuf::internal::ExtensionInfo>
            (&Register::local_static_registry->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ,info);
  pcVar2 = (pfVar20->
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  uVar3 = (pfVar20->
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          ).settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if ((uVar3 + 1 & uVar3) != 0) {
LAB_001cf36e:
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar22 = ((ulong)info->message ^ 0x463ad8) * -0x234dd359734ecb13;
  uVar22 = ((uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
             (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
             (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 | (uVar22 & 0xff00) << 0x28 |
            uVar22 << 0x38) ^ (ulong)info->message) * -0x234dd359734ecb13;
  uVar26 = ((ulong)(uint)info->number ^
           (uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 | (uVar22 & 0xff0000000000) >> 0x18
            | (uVar22 & 0xff00000000) >> 8 | (uVar22 & 0xff000000) << 8 |
            (uVar22 & 0xff0000) << 0x18 | (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38)) *
           -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 | (uVar26 & 0xff0000000000) >> 0x18
            | (uVar26 & 0xff00000000) >> 8 | (uVar26 & 0xff000000) << 8 |
            (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
  uVar22 = ((ulong)common >> 7 ^ (ulong)pcVar2 >> 0xc) & uVar3;
  uVar14 = (undefined1)(uVar26 >> 0x38);
  auVar31 = ZEXT216(CONCAT11(uVar14,uVar14) & 0x7f7f);
  auVar31 = pshuflw(auVar31,auVar31,0);
  uVar30 = auVar31._0_4_;
  auVar31._4_4_ = uVar30;
  auVar31._0_4_ = uVar30;
  auVar31._8_4_ = uVar30;
  auVar31._12_4_ = uVar30;
  local_a8 = 0;
  do {
    pcVar1 = pcVar2 + uVar22;
    auVar34[0] = -(auVar31[0] == *pcVar1);
    auVar34[1] = -(auVar31[1] == pcVar1[1]);
    auVar34[2] = -(auVar31[2] == pcVar1[2]);
    auVar34[3] = -(auVar31[3] == pcVar1[3]);
    auVar34[4] = -(auVar31[4] == pcVar1[4]);
    auVar34[5] = -(auVar31[5] == pcVar1[5]);
    auVar34[6] = -(auVar31[6] == pcVar1[6]);
    auVar34[7] = -(auVar31[7] == pcVar1[7]);
    auVar34[8] = -(auVar31[8] == pcVar1[8]);
    auVar34[9] = -(auVar31[9] == pcVar1[9]);
    auVar34[10] = -(auVar31[10] == pcVar1[10]);
    auVar34[0xb] = -(auVar31[0xb] == pcVar1[0xb]);
    auVar34[0xc] = -(auVar31[0xc] == pcVar1[0xc]);
    auVar34[0xd] = -(auVar31[0xd] == pcVar1[0xd]);
    auVar34[0xe] = -(auVar31[0xe] == pcVar1[0xe]);
    auVar34[0xf] = -(auVar31[0xf] == pcVar1[0xf]);
    uVar23 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf;
    uVar21 = (uint)uVar23;
    if (uVar23 != 0) {
      lVar4 = *(long *)((long)&(pfVar20->
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                               ).settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8);
      do {
        uVar6 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        uVar26 = uVar6 + uVar22 & uVar3;
        lVar24 = uVar26 * 0x30;
        if ((*(MessageLite **)(lVar4 + lVar24) == info->message) &&
           (*(int *)(lVar4 + 8 + lVar24) == info->number)) {
          pcVar2 = (pfVar20->
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                   ).settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
          if (pcVar2 == (ctrl_t *)0x0) goto LAB_001cf34f;
          in_R10.slot_ = (slot_type *)(lVar4 + lVar24);
          in_R9 = (PolicyFunctions *)(pcVar2 + uVar26);
          bVar15 = false;
          goto LAB_001cf09a;
        }
        uVar23 = (ushort)(uVar21 - 1) & (ushort)uVar21;
        uVar21 = CONCAT22((short)(uVar21 - 1 >> 0x10),uVar23);
      } while (uVar23 != 0);
    }
    auVar32[0] = -(*pcVar1 == kEmpty);
    auVar32[1] = -(pcVar1[1] == kEmpty);
    auVar32[2] = -(pcVar1[2] == kEmpty);
    auVar32[3] = -(pcVar1[3] == kEmpty);
    auVar32[4] = -(pcVar1[4] == kEmpty);
    auVar32[5] = -(pcVar1[5] == kEmpty);
    auVar32[6] = -(pcVar1[6] == kEmpty);
    auVar32[7] = -(pcVar1[7] == kEmpty);
    auVar32[8] = -(pcVar1[8] == kEmpty);
    auVar32[9] = -(pcVar1[9] == kEmpty);
    auVar32[10] = -(pcVar1[10] == kEmpty);
    auVar32[0xb] = -(pcVar1[0xb] == kEmpty);
    auVar32[0xc] = -(pcVar1[0xc] == kEmpty);
    auVar32[0xd] = -(pcVar1[0xd] == kEmpty);
    auVar32[0xe] = -(pcVar1[0xe] == kEmpty);
    auVar32[0xf] = -(pcVar1[0xf] == kEmpty);
    uVar23 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
    if (uVar23 == 0) {
      if ((pfVar20->
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          ).settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ < local_a8 + 0x10) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                     );
      }
      uVar22 = uVar22 + local_a8 + 0x10 & uVar3;
      local_a8 = local_a8 + 0x10;
    }
    else {
      local_78 = auVar31;
      bVar15 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                         ((pfVar20->
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                          ).settings_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_,(size_t)common,
                          (pfVar20->
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                          ).settings_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control);
      if (bVar15) {
        uVar7 = 0xf;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar21 = (ushort)((uVar7 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar21 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
      }
      target.probe_length =
           (size_t)absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
                   ::GetPolicyFunctions()::value;
      target.offset = local_a8;
      sVar18 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                         ((container_internal *)pfVar20,common,uVar21 + uVar22 & uVar3,target,in_R9)
      ;
      pcVar1 = (pfVar20->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
      if (pcVar1 == (ctrl_t *)0x0) {
LAB_001cf34f:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>]"
                     );
      }
      in_R9 = (PolicyFunctions *)(pcVar1 + sVar18);
      in_R10.slot_ = (slot_type *)
                     (sVar18 * 0x30 +
                     (long)(pfVar20->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                           ).settings_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_.heap.slot_array.p);
      auVar31 = local_78;
    }
  } while (uVar23 == 0);
  bVar15 = true;
LAB_001cf09a:
  if (bVar15) {
    sVar18 = (pfVar20->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    (pfVar20->
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0xffffffffffffff9c;
    pMVar8 = info->message;
    iVar17 = info->number;
    FVar12 = info->type;
    bVar27 = info->is_repeated;
    bVar28 = info->is_packed;
    LVar13 = info->is_lazy;
    pEVar9 = (info->field_6).enum_validity_check.func;
    pvVar10 = (info->field_6).enum_validity_check.arg;
    p_Var11 = info->lazy_eager_verify_func;
    (in_R10.slot_)->descriptor = info->descriptor;
    (in_R10.slot_)->lazy_eager_verify_func = p_Var11;
    ((in_R10.slot_)->field_6).enum_validity_check.func = pEVar9;
    ((in_R10.slot_)->field_6).enum_validity_check.arg = pvVar10;
    (in_R10.slot_)->message = pMVar8;
    *(int *)((long)in_R10 + 8) = iVar17;
    *(FieldType *)((long)in_R10 + 0xc) = FVar12;
    *(bool *)((long)in_R10 + 0xd) = bVar27;
    *(bool *)((long)in_R10 + 0xe) = bVar28;
    *(LazyAnnotation *)((long)in_R10 + 0xf) = LVar13;
    local_88.ctrl_ = (ctrl_t *)in_R9;
    local_88.field_1 = in_R10;
    local_60 = in_R10;
    local_58 = in_R9;
    absl::lts_20250127::container_internal::CommonFields::set_capacity
              ((CommonFields *)pfVar20,sVar18);
    key = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          ::iterator::operator*(&local_88);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::AssertOnFind<google::protobuf::internal::ExtensionInfo>
              (&pfVar20->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               ,key);
    pcVar2 = (pfVar20->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             heap_or_soo_.heap.control;
    uVar3 = (pfVar20->
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
            ).settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    if ((uVar3 + 1 & uVar3) != 0) goto LAB_001cf36e;
    uVar22 = ((ulong)key->message ^ 0x463ad8) * -0x234dd359734ecb13;
    uVar22 = ((uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
               (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
               (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 | (uVar22 & 0xff00) << 0x28
              | uVar22 << 0x38) ^ (ulong)key->message) * -0x234dd359734ecb13;
    uVar22 = ((ulong)(uint)key->number ^
             (uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
              (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
              (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 | (uVar22 & 0xff00) << 0x28 |
             uVar22 << 0x38)) * -0x234dd359734ecb13;
    uVar26 = ((uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
               (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
               (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 | (uVar22 & 0xff00) << 0x28
              | uVar22 << 0x38) >> 7 ^ (ulong)pcVar2 >> 0xc) & uVar3;
    bVar16 = (byte)(uVar22 >> 0x38);
    local_50.inner_.ctrl_ = (ctrl_t *)(ulong)(bVar16 & 0x7f);
    auVar31 = ZEXT216(CONCAT11(bVar16,bVar16) & 0x7f7f);
    auVar31 = pshuflw(auVar31,auVar31,0);
    uVar30 = auVar31._0_4_;
    auVar36._4_4_ = uVar30;
    auVar36._0_4_ = uVar30;
    auVar36._8_4_ = uVar30;
    auVar36._12_4_ = uVar30;
    local_98 = 0;
    aVar25 = (anon_union_8_1_a8a14541_for_iterator_2)info;
    local_78 = auVar36;
    do {
      pcVar1 = pcVar2 + uVar26;
      auVar35[0] = -(auVar36[0] == *pcVar1);
      auVar35[1] = -(auVar36[1] == pcVar1[1]);
      auVar35[2] = -(auVar36[2] == pcVar1[2]);
      auVar35[3] = -(auVar36[3] == pcVar1[3]);
      auVar35[4] = -(auVar36[4] == pcVar1[4]);
      auVar35[5] = -(auVar36[5] == pcVar1[5]);
      auVar35[6] = -(auVar36[6] == pcVar1[6]);
      auVar35[7] = -(auVar36[7] == pcVar1[7]);
      auVar35[8] = -(auVar36[8] == pcVar1[8]);
      auVar35[9] = -(auVar36[9] == pcVar1[9]);
      auVar35[10] = -(auVar36[10] == pcVar1[10]);
      auVar35[0xb] = -(auVar36[0xb] == pcVar1[0xb]);
      auVar35[0xc] = -(auVar36[0xc] == pcVar1[0xc]);
      auVar35[0xd] = -(auVar36[0xd] == pcVar1[0xd]);
      auVar35[0xe] = -(auVar36[0xe] == pcVar1[0xe]);
      auVar35[0xf] = -(auVar36[0xf] == pcVar1[0xf]);
      uVar23 = (ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe | (ushort)(auVar35[0xf] >> 7) << 0xf;
      uVar21 = (uint)uVar23;
      bVar27 = uVar23 == 0;
      if (!bVar27) {
        pcVar5 = (pfVar20->
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                 ).settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.control;
        lVar4 = *(long *)((long)&(pfVar20->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                                 ).settings_.
                                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                 .
                                 super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                 .value.heap_or_soo_ + 8);
        bVar27 = false;
        do {
          uVar6 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar22 = uVar6 + uVar26 & uVar3;
          lVar24 = uVar22 * 0x30;
          bVar28 = *(MessageLite **)(lVar4 + lVar24) == key->message;
          bVar29 = *(int *)(lVar4 + 8 + lVar24) == key->number;
          if (bVar29 && bVar28) {
            if (pcVar5 == (ctrl_t *)0x0) goto LAB_001cf34f;
            aVar25.slot_ = (slot_type *)(lVar24 + lVar4);
            local_50.inner_.ctrl_ = pcVar5 + uVar22;
          }
          if (bVar29 && bVar28) break;
          uVar23 = (ushort)(uVar21 - 1) & (ushort)uVar21;
          uVar21 = CONCAT22((short)(uVar21 - 1 >> 0x10),uVar23);
          bVar27 = uVar23 == 0;
        } while (!bVar27);
      }
      if (bVar27) {
        auVar33[0] = -(*pcVar1 == kEmpty);
        auVar33[1] = -(pcVar1[1] == kEmpty);
        auVar33[2] = -(pcVar1[2] == kEmpty);
        auVar33[3] = -(pcVar1[3] == kEmpty);
        auVar33[4] = -(pcVar1[4] == kEmpty);
        auVar33[5] = -(pcVar1[5] == kEmpty);
        auVar33[6] = -(pcVar1[6] == kEmpty);
        auVar33[7] = -(pcVar1[7] == kEmpty);
        auVar33[8] = -(pcVar1[8] == kEmpty);
        auVar33[9] = -(pcVar1[9] == kEmpty);
        auVar33[10] = -(pcVar1[10] == kEmpty);
        auVar33[0xb] = -(pcVar1[0xb] == kEmpty);
        auVar33[0xc] = -(pcVar1[0xc] == kEmpty);
        auVar33[0xd] = -(pcVar1[0xd] == kEmpty);
        auVar33[0xe] = -(pcVar1[0xe] == kEmpty);
        auVar33[0xf] = -(pcVar1[0xf] == kEmpty);
        if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar33 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar33 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar33 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar33 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar33 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar33 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar33 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar33 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar33 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar33[0xf]
           ) {
          if ((pfVar20->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
              ).settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .capacity_ < local_98 + 0x10) {
            __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xe37,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                         );
          }
          uVar26 = uVar26 + local_98 + 0x10 & uVar3;
          bVar27 = true;
          local_98 = local_98 + 0x10;
        }
        else {
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          ::AssertNotDebugCapacity
                    (&pfVar20->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                    );
          local_50.inner_.ctrl_ = (ctrl_t *)0x0;
          bVar27 = false;
          auVar36 = local_78;
        }
      }
      else {
        bVar27 = false;
      }
    } while (bVar27);
    local_40.inner_.ctrl_ = (ctrl_t *)local_58;
    local_40.inner_.field_1 = local_60;
    local_50.inner_.field_1 = aVar25;
    bVar27 = absl::lts_20250127::container_internal::operator==(&local_50,&local_40);
    if (!bVar27) {
      __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xfe2,
                    "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, Args = <const google::protobuf::internal::ExtensionInfo &>]"
                   );
    }
    if (bVar15) {
      return;
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0x65);
  sVar37._M_str = "Multiple extension registrations for type \"";
  sVar37._M_len = 0x2b;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            ((LogMessage *)&local_88,sVar37);
  sVar37 = MessageLite::GetTypeName(info->message);
  pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_88,sVar37)
  ;
  str._M_str = "\", field number ";
  str._M_len = 0x10;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar19,str);
  local_50.inner_.ctrl_ = (ctrl_t *)CONCAT44(local_50.inner_.ctrl_._4_4_,info->number);
  pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                      (pLVar19,(int *)&local_50);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar19,(char (*) [2])0x32104d);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_88);
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!local_static_registry->insert(info).second) {
    ABSL_LOG(FATAL) << "Multiple extension registrations for type \""
                    << info.message->GetTypeName() << "\", field number "
                    << info.number << ".";
  }
}